

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nocaseCollatingFunc(void *NotUsed,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  int iVar1;
  int iVar2;
  
  iVar2 = nKey1 - nKey2;
  if (nKey1 < nKey2) {
    nKey2 = nKey1;
  }
  iVar1 = sqlite3_strnicmp((char *)pKey1,(char *)pKey2,nKey2);
  if (iVar1 == 0) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static int nocaseCollatingFunc(
  void *NotUsed,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  int r = sqlite3StrNICmp(
      (const char *)pKey1, (const char *)pKey2, (nKey1<nKey2)?nKey1:nKey2);
  UNUSED_PARAMETER(NotUsed);
  if( 0==r ){
    r = nKey1-nKey2;
  }
  return r;
}